

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O2

Curve * __thiscall ON_ShutLining::Curve::operator=(Curve *this,Curve *c)

{
  bool bVar1;
  int p;
  double d;
  ON_UUID local_20;
  
  if (this != c) {
    local_20 = Id(c);
    SetId(this,&local_20);
    bVar1 = Enabled(c);
    SetEnabled(this,bVar1);
    d = Radius(c);
    SetRadius(this,d);
    p = Profile(c);
    SetProfile(this,p);
    bVar1 = Pull(c);
    SetPull(this,bVar1);
    bVar1 = IsBump(c);
    SetIsBump(this,bVar1);
  }
  return this;
}

Assistant:

const ON_ShutLining::Curve& ON_ShutLining::Curve::operator = (const ON_ShutLining::Curve& c)
{
  if (this != &c)
  {
    SetId     (c.Id());
    SetEnabled(c.Enabled());
    SetRadius (c.Radius());
    SetProfile(c.Profile());
    SetPull   (c.Pull());
    SetIsBump (c.IsBump());
  }

  return *this;
}